

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void __thiscall
trompeloeil::list<trompeloeil::side_effect_base<void_()>,_trompeloeil::delete_disposer>::~list
          (list<trompeloeil::side_effect_base<void_()>,_trompeloeil::delete_disposer> *this)

{
  ~list(this);
  operator_delete(this);
  return;
}

Assistant:

list<T, Disposer>::~list()
  {
    auto i = this->begin();
    while (i != this->end())
    {
      auto p = i++;
      Disposer::dispose(&*p);
    }
  }